

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGB4444ToUVRow_C(uint8_t *src_argb4444,int src_stride_argb4444,uint8_t *dst_u,uint8_t *dst_v,
                      int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  int iVar8;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  int in_ESI;
  byte *in_RDI;
  uint in_R8D;
  uint8_t ar_1;
  uint8_t ag_1;
  uint8_t ab_1;
  uint8_t r2_1;
  uint8_t g2_1;
  uint8_t b2_1;
  uint8_t r0_1;
  uint8_t g0_1;
  uint8_t b0_1;
  uint8_t ar;
  uint8_t ag;
  uint8_t ab;
  uint8_t r3;
  uint8_t g3;
  uint8_t b3;
  uint8_t r2;
  uint8_t g2;
  uint8_t b2;
  uint8_t r1;
  uint8_t g1;
  uint8_t b1;
  uint8_t r0;
  uint8_t g0;
  uint8_t b0;
  int x;
  uint8_t *next_argb4444;
  int local_34;
  byte *local_30;
  undefined1 *local_20;
  undefined1 *local_18;
  byte *local_8;
  
  local_30 = in_RDI + in_ESI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_34 = 0; local_34 < (int)(in_R8D - 1); local_34 = local_34 + 2) {
    bVar1 = (byte)((int)(uint)*local_8 >> 4);
    bVar2 = (byte)((int)(uint)local_8[2] >> 4);
    bVar3 = (byte)((int)(uint)*local_30 >> 4);
    bVar4 = (byte)((int)(uint)local_30[2] >> 4);
    uVar5 = (uint8_t)(((int)((uint)(byte)((*local_8 & 0xf) << 4 | *local_8 & 0xf) +
                             (uint)(byte)((*local_30 & 0xf) << 4 | *local_30 & 0xf) + 1) >> 1) +
                      ((int)((uint)(byte)((local_8[2] & 0xf) << 4 | local_8[2] & 0xf) +
                             (uint)(byte)((local_30[2] & 0xf) << 4 | local_30[2] & 0xf) + 1) >> 1) +
                      1 >> 1);
    uVar6 = (uint8_t)(((int)((uint)(byte)(bVar1 << 4 | bVar1) + (uint)(byte)(bVar3 << 4 | bVar3) + 1
                            ) >> 1) +
                      ((int)((uint)(byte)(bVar2 << 4 | bVar2) + (uint)(byte)(bVar4 << 4 | bVar4) + 1
                            ) >> 1) + 1 >> 1);
    uVar7 = (uint8_t)(((int)((uint)(byte)((local_8[1] & 0xf) << 4 | local_8[1] & 0xf) +
                             (uint)(byte)((local_30[1] & 0xf) << 4 | local_30[1] & 0xf) + 1) >> 1) +
                      ((int)((uint)(byte)((local_8[3] & 0xf) << 4 | local_8[3] & 0xf) +
                             (uint)(byte)((local_30[3] & 0xf) << 4 | local_30[3] & 0xf) + 1) >> 1) +
                      1 >> 1);
    iVar8 = libyuv::RGBToU(uVar7,uVar6,uVar5);
    *local_18 = (char)iVar8;
    iVar8 = libyuv::RGBToV(uVar7,uVar6,uVar5);
    *local_20 = (char)iVar8;
    local_8 = local_8 + 4;
    local_30 = local_30 + 4;
    local_18 = local_18 + 1;
    local_20 = local_20 + 1;
  }
  if ((in_R8D & 1) != 0) {
    bVar1 = (byte)((int)(uint)*local_8 >> 4);
    bVar2 = (byte)((int)(uint)*local_30 >> 4);
    uVar5 = (uint8_t)((int)((uint)(byte)((*local_8 & 0xf) << 4 | *local_8 & 0xf) +
                            (uint)(byte)((*local_30 & 0xf) << 4 | *local_30 & 0xf) + 1) >> 1);
    uVar6 = (uint8_t)((int)((uint)(byte)(bVar1 << 4 | bVar1) + (uint)(byte)(bVar2 << 4 | bVar2) + 1)
                     >> 1);
    uVar7 = (uint8_t)((int)((uint)(byte)((local_8[1] & 0xf) << 4 | local_8[1] & 0xf) +
                            (uint)(byte)((local_30[1] & 0xf) << 4 | local_30[1] & 0xf) + 1) >> 1);
    iVar8 = libyuv::RGBToU(uVar7,uVar6,uVar5);
    *local_18 = (char)iVar8;
    iVar8 = libyuv::RGBToV(uVar7,uVar6,uVar5);
    *local_20 = (char)iVar8;
  }
  return;
}

Assistant:

void ARGB4444ToUVRow_C(const uint8_t* src_argb4444,
                       int src_stride_argb4444,
                       uint8_t* dst_u,
                       uint8_t* dst_v,
                       int width) {
  const uint8_t* next_argb4444 = src_argb4444 + src_stride_argb4444;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_argb4444[0] & 0x0f;
    uint8_t g0 = src_argb4444[0] >> 4;
    uint8_t r0 = src_argb4444[1] & 0x0f;
    uint8_t b1 = src_argb4444[2] & 0x0f;
    uint8_t g1 = src_argb4444[2] >> 4;
    uint8_t r1 = src_argb4444[3] & 0x0f;
    uint8_t b2 = next_argb4444[0] & 0x0f;
    uint8_t g2 = next_argb4444[0] >> 4;
    uint8_t r2 = next_argb4444[1] & 0x0f;
    uint8_t b3 = next_argb4444[2] & 0x0f;
    uint8_t g3 = next_argb4444[2] >> 4;
    uint8_t r3 = next_argb4444[3] & 0x0f;

    b0 = (b0 << 4) | b0;
    g0 = (g0 << 4) | g0;
    r0 = (r0 << 4) | r0;
    b1 = (b1 << 4) | b1;
    g1 = (g1 << 4) | g1;
    r1 = (r1 << 4) | r1;
    b2 = (b2 << 4) | b2;
    g2 = (g2 << 4) | g2;
    r2 = (r2 << 4) | r2;
    b3 = (b3 << 4) | b3;
    g3 = (g3 << 4) | g3;
    r3 = (r3 << 4) | r3;

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(AVGB(b0, b2), AVGB(b1, b3));
    uint8_t ag = AVGB(AVGB(g0, g2), AVGB(g1, g3));
    uint8_t ar = AVGB(AVGB(r0, r2), AVGB(r1, r3));
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = (b0 + b1 + b2 + b3 + 1) >> 1;
    uint16_t g = (g0 + g1 + g2 + g3 + 1) >> 1;
    uint16_t r = (r0 + r1 + r2 + r3 + 1) >> 1;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif

    src_argb4444 += 4;
    next_argb4444 += 4;
    dst_u += 1;
    dst_v += 1;
  }
  if (width & 1) {
    uint8_t b0 = src_argb4444[0] & 0x0f;
    uint8_t g0 = src_argb4444[0] >> 4;
    uint8_t r0 = src_argb4444[1] & 0x0f;
    uint8_t b2 = next_argb4444[0] & 0x0f;
    uint8_t g2 = next_argb4444[0] >> 4;
    uint8_t r2 = next_argb4444[1] & 0x0f;

    b0 = (b0 << 4) | b0;
    g0 = (g0 << 4) | g0;
    r0 = (r0 << 4) | r0;
    b2 = (b2 << 4) | b2;
    g2 = (g2 << 4) | g2;
    r2 = (r2 << 4) | r2;

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(b0, b2);
    uint8_t ag = AVGB(g0, g2);
    uint8_t ar = AVGB(r0, r2);
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = b0 + b2;
    uint16_t g = g0 + g2;
    uint16_t r = r0 + r2;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif
  }
}